

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void __thiscall pybind11::arg_v::arg_v<int>(arg_v *this,arg *base,int *x,char *descr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  PyObject *pPVar4;
  size_t sVar5;
  char *__s;
  
  uVar1 = *(undefined4 *)((long)&base->name + 4);
  uVar2 = *(undefined4 *)&base->field_0x8;
  uVar3 = *(undefined4 *)&base->field_0xc;
  *(undefined4 *)&(this->super_arg).name = *(undefined4 *)&base->name;
  *(undefined4 *)((long)&(this->super_arg).name + 4) = uVar1;
  *(undefined4 *)&(this->super_arg).field_0x8 = uVar2;
  *(undefined4 *)&(this->super_arg).field_0xc = uVar3;
  pPVar4 = (PyObject *)PyLong_FromSsize_t((long)*x);
  (this->value).super_handle.m_ptr = pPVar4;
  this->descr = descr;
  __s = _put + (*_put == '*');
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->type,__s,__s + sVar5);
  detail::clean_type_id(&this->type);
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    { }